

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void VP8LHistogramStoreRefs
               (VP8LBackwardRefs *refs,_func_int_int_int *distance_modifier,
               int distance_modifier_arg0,VP8LHistogram *histo)

{
  int iVar1;
  VP8LBackwardRefs *in_RDI;
  VP8LRefsCursor c;
  VP8LRefsCursor local_38 [2];
  
  VP8LRefsCursorInit(local_38,in_RDI);
  while( true ) {
    iVar1 = VP8LRefsCursorOk(local_38);
    if (iVar1 == 0) break;
    HistogramAddSinglePixOrCopy
              ((VP8LHistogram *)c.last_pos,(PixOrCopy *)c.cur_block,(_func_int_int_int *)c.cur_pos,
               (int)((ulong)in_RDI >> 0x20));
    VP8LRefsCursorNext((VP8LRefsCursor *)0x19a7d0);
  }
  return;
}

Assistant:

void VP8LHistogramStoreRefs(const VP8LBackwardRefs* const refs,
                            int (*const distance_modifier)(int, int),
                            int distance_modifier_arg0,
                            VP8LHistogram* const histo) {
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    HistogramAddSinglePixOrCopy(histo, c.cur_pos, distance_modifier,
                                distance_modifier_arg0);
    VP8LRefsCursorNext(&c);
  }
}